

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::EnumDescriptor::DebugString
          (EnumDescriptor *this,int depth,string *contents,DebugStringOptions *debug_string_options)

{
  int iVar1;
  int iVar2;
  string *psVar3;
  EnumOptions *options;
  FileDescriptor *this_00;
  DescriptorPool *pool;
  EnumValueDescriptor *this_01;
  long lVar4;
  SubstituteArg local_1038;
  SubstituteArg local_1008;
  SubstituteArg local_fd8;
  SubstituteArg local_fa8;
  SubstituteArg local_f78;
  SubstituteArg local_f48;
  SubstituteArg local_f18;
  SubstituteArg local_ee8;
  SubstituteArg local_eb8;
  SubstituteArg local_e88;
  SubstituteArg local_e58;
  SubstituteArg local_e28;
  SubstituteArg local_df8;
  SubstituteArg local_dc8;
  SubstituteArg local_d98;
  SubstituteArg local_d68;
  SubstituteArg local_d38;
  SubstituteArg local_d08;
  SubstituteArg local_cd8;
  string local_ca8;
  SubstituteArg local_c88;
  int local_c54;
  undefined1 local_c50 [4];
  int i_2;
  SubstituteArg local_c20;
  SubstituteArg local_bf0;
  SubstituteArg local_bc0;
  SubstituteArg local_b90;
  SubstituteArg local_b60;
  SubstituteArg local_b30;
  SubstituteArg local_b00;
  SubstituteArg local_ad0;
  SubstituteArg local_aa0;
  SubstituteArg local_a70;
  SubstituteArg local_a40;
  SubstituteArg local_a10;
  SubstituteArg local_9e0;
  SubstituteArg local_9b0;
  SubstituteArg local_980;
  SubstituteArg local_950;
  SubstituteArg local_920;
  SubstituteArg local_8f0;
  SubstituteArg local_8c0;
  SubstituteArg local_890;
  SubstituteArg local_860;
  SubstituteArg local_830;
  SubstituteArg local_800;
  SubstituteArg local_7d0;
  SubstituteArg local_7a0;
  SubstituteArg local_770;
  SubstituteArg local_740;
  SubstituteArg local_710;
  SubstituteArg local_6e0;
  SubstituteArg local_6b0;
  SubstituteArg local_680;
  SubstituteArg local_650;
  SubstituteArg local_620;
  SubstituteArg local_5f0;
  SubstituteArg local_5c0;
  SubstituteArg local_590;
  SubstituteArg local_560;
  SubstituteArg local_530;
  SubstituteArg local_500;
  ReservedRange *local_4d0;
  ReservedRange *range;
  undefined1 local_4c0 [4];
  int i_1;
  SubstituteArg local_490;
  SubstituteArg local_460;
  SubstituteArg local_430;
  SubstituteArg local_400;
  SubstituteArg local_3d0;
  SubstituteArg local_3a0;
  SubstituteArg local_370;
  SubstituteArg local_340;
  SubstituteArg local_310;
  int local_2dc;
  undefined1 local_2d8 [4];
  int i;
  SubstituteArg local_2a8;
  SubstituteArg local_278;
  SubstituteArg local_248;
  SubstituteArg local_218;
  SubstituteArg local_1e8;
  SubstituteArg local_1b8;
  SubstituteArg local_188;
  SubstituteArg local_158;
  SubstituteArg local_128;
  undefined1 local_f8 [8];
  SourceLocationCommentPrinter comment_printer;
  allocator local_49;
  undefined1 local_48 [8];
  string prefix;
  DebugStringOptions *debug_string_options_local;
  string *contents_local;
  int depth_local;
  EnumDescriptor *this_local;
  
  prefix.field_2._8_8_ = debug_string_options;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_48,(long)(depth * 2),' ',&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  anon_unknown_1::SourceLocationCommentPrinter::
  SourceLocationCommentPrinter<google::protobuf::EnumDescriptor>
            ((SourceLocationCommentPrinter *)local_f8,this,(string *)local_48,
             (DebugStringOptions *)prefix.field_2._8_8_);
  anon_unknown_1::SourceLocationCommentPrinter::AddPreComment
            ((SourceLocationCommentPrinter *)local_f8,contents);
  strings::internal::SubstituteArg::SubstituteArg(&local_128,(string *)local_48);
  psVar3 = name_abi_cxx11_(this);
  strings::internal::SubstituteArg::SubstituteArg(&local_158,psVar3);
  strings::internal::SubstituteArg::SubstituteArg(&local_188);
  strings::internal::SubstituteArg::SubstituteArg(&local_1b8);
  strings::internal::SubstituteArg::SubstituteArg(&local_1e8);
  strings::internal::SubstituteArg::SubstituteArg(&local_218);
  strings::internal::SubstituteArg::SubstituteArg(&local_248);
  strings::internal::SubstituteArg::SubstituteArg(&local_278);
  strings::internal::SubstituteArg::SubstituteArg(&local_2a8);
  strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_2d8);
  strings::SubstituteAndAppend
            (contents,"$0enum $1 {\n",&local_128,&local_158,&local_188,&local_1b8,&local_1e8,
             &local_218,&local_248,&local_278,&local_2a8,(SubstituteArg *)local_2d8);
  options = EnumDescriptor::options(this);
  this_00 = file(this);
  pool = FileDescriptor::pool(this_00);
  anon_unknown_1::FormatLineOptions(depth + 1,&options->super_Message,pool,contents);
  for (local_2dc = 0; iVar2 = local_2dc, iVar1 = value_count(this), iVar2 < iVar1;
      local_2dc = local_2dc + 1) {
    this_01 = value(this,local_2dc);
    EnumValueDescriptor::DebugString
              (this_01,depth + 1,contents,(DebugStringOptions *)prefix.field_2._8_8_);
  }
  iVar2 = reserved_range_count(this);
  if (0 < iVar2) {
    strings::internal::SubstituteArg::SubstituteArg(&local_310,(string *)local_48);
    strings::internal::SubstituteArg::SubstituteArg(&local_340);
    strings::internal::SubstituteArg::SubstituteArg(&local_370);
    strings::internal::SubstituteArg::SubstituteArg(&local_3a0);
    strings::internal::SubstituteArg::SubstituteArg(&local_3d0);
    strings::internal::SubstituteArg::SubstituteArg(&local_400);
    strings::internal::SubstituteArg::SubstituteArg(&local_430);
    strings::internal::SubstituteArg::SubstituteArg(&local_460);
    strings::internal::SubstituteArg::SubstituteArg(&local_490);
    strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_4c0);
    strings::SubstituteAndAppend
              (contents,"$0  reserved ",&local_310,&local_340,&local_370,&local_3a0,&local_3d0,
               &local_400,&local_430,&local_460,&local_490,(SubstituteArg *)local_4c0);
    for (range._4_4_ = 0; iVar2 = range._4_4_, iVar1 = reserved_range_count(this), iVar2 < iVar1;
        range._4_4_ = range._4_4_ + 1) {
      local_4d0 = reserved_range(this,range._4_4_);
      if (local_4d0->end == local_4d0->start) {
        strings::internal::SubstituteArg::SubstituteArg(&local_500,local_4d0->start);
        strings::internal::SubstituteArg::SubstituteArg(&local_530);
        strings::internal::SubstituteArg::SubstituteArg(&local_560);
        strings::internal::SubstituteArg::SubstituteArg(&local_590);
        strings::internal::SubstituteArg::SubstituteArg(&local_5c0);
        strings::internal::SubstituteArg::SubstituteArg(&local_5f0);
        strings::internal::SubstituteArg::SubstituteArg(&local_620);
        strings::internal::SubstituteArg::SubstituteArg(&local_650);
        strings::internal::SubstituteArg::SubstituteArg(&local_680);
        strings::internal::SubstituteArg::SubstituteArg(&local_6b0);
        strings::SubstituteAndAppend
                  (contents,"$0, ",&local_500,&local_530,&local_560,&local_590,&local_5c0,&local_5f0
                   ,&local_620,&local_650,&local_680,&local_6b0);
      }
      else if (local_4d0->end == 0x7fffffff) {
        strings::internal::SubstituteArg::SubstituteArg(&local_6e0,local_4d0->start);
        strings::internal::SubstituteArg::SubstituteArg(&local_710);
        strings::internal::SubstituteArg::SubstituteArg(&local_740);
        strings::internal::SubstituteArg::SubstituteArg(&local_770);
        strings::internal::SubstituteArg::SubstituteArg(&local_7a0);
        strings::internal::SubstituteArg::SubstituteArg(&local_7d0);
        strings::internal::SubstituteArg::SubstituteArg(&local_800);
        strings::internal::SubstituteArg::SubstituteArg(&local_830);
        strings::internal::SubstituteArg::SubstituteArg(&local_860);
        strings::internal::SubstituteArg::SubstituteArg(&local_890);
        strings::SubstituteAndAppend
                  (contents,"$0 to max, ",&local_6e0,&local_710,&local_740,&local_770,&local_7a0,
                   &local_7d0,&local_800,&local_830,&local_860,&local_890);
      }
      else {
        strings::internal::SubstituteArg::SubstituteArg(&local_8c0,local_4d0->start);
        strings::internal::SubstituteArg::SubstituteArg(&local_8f0,local_4d0->end);
        strings::internal::SubstituteArg::SubstituteArg(&local_920);
        strings::internal::SubstituteArg::SubstituteArg(&local_950);
        strings::internal::SubstituteArg::SubstituteArg(&local_980);
        strings::internal::SubstituteArg::SubstituteArg(&local_9b0);
        strings::internal::SubstituteArg::SubstituteArg(&local_9e0);
        strings::internal::SubstituteArg::SubstituteArg(&local_a10);
        strings::internal::SubstituteArg::SubstituteArg(&local_a40);
        strings::internal::SubstituteArg::SubstituteArg(&local_a70);
        strings::SubstituteAndAppend
                  (contents,"$0 to $1, ",&local_8c0,&local_8f0,&local_920,&local_950,&local_980,
                   &local_9b0,&local_9e0,&local_a10,&local_a40,&local_a70);
      }
    }
    lVar4 = std::__cxx11::string::size();
    std::__cxx11::string::replace((ulong)contents,lVar4 - 2,(char *)0x2);
  }
  iVar2 = reserved_name_count(this);
  if (0 < iVar2) {
    strings::internal::SubstituteArg::SubstituteArg(&local_aa0,(string *)local_48);
    strings::internal::SubstituteArg::SubstituteArg(&local_ad0);
    strings::internal::SubstituteArg::SubstituteArg(&local_b00);
    strings::internal::SubstituteArg::SubstituteArg(&local_b30);
    strings::internal::SubstituteArg::SubstituteArg(&local_b60);
    strings::internal::SubstituteArg::SubstituteArg(&local_b90);
    strings::internal::SubstituteArg::SubstituteArg(&local_bc0);
    strings::internal::SubstituteArg::SubstituteArg(&local_bf0);
    strings::internal::SubstituteArg::SubstituteArg(&local_c20);
    strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_c50);
    strings::SubstituteAndAppend
              (contents,"$0  reserved ",&local_aa0,&local_ad0,&local_b00,&local_b30,&local_b60,
               &local_b90,&local_bc0,&local_bf0,&local_c20,(SubstituteArg *)local_c50);
    for (local_c54 = 0; iVar2 = local_c54, iVar1 = reserved_name_count(this), iVar2 < iVar1;
        local_c54 = local_c54 + 1) {
      psVar3 = reserved_name_abi_cxx11_(this,local_c54);
      CEscape(&local_ca8,psVar3);
      strings::internal::SubstituteArg::SubstituteArg(&local_c88,&local_ca8);
      strings::internal::SubstituteArg::SubstituteArg(&local_cd8);
      strings::internal::SubstituteArg::SubstituteArg(&local_d08);
      strings::internal::SubstituteArg::SubstituteArg(&local_d38);
      strings::internal::SubstituteArg::SubstituteArg(&local_d68);
      strings::internal::SubstituteArg::SubstituteArg(&local_d98);
      strings::internal::SubstituteArg::SubstituteArg(&local_dc8);
      strings::internal::SubstituteArg::SubstituteArg(&local_df8);
      strings::internal::SubstituteArg::SubstituteArg(&local_e28);
      strings::internal::SubstituteArg::SubstituteArg(&local_e58);
      strings::SubstituteAndAppend
                (contents,"\"$0\", ",&local_c88,&local_cd8,&local_d08,&local_d38,&local_d68,
                 &local_d98,&local_dc8,&local_df8,&local_e28,&local_e58);
      std::__cxx11::string::~string((string *)&local_ca8);
    }
    lVar4 = std::__cxx11::string::size();
    std::__cxx11::string::replace((ulong)contents,lVar4 - 2,(char *)0x2);
  }
  strings::internal::SubstituteArg::SubstituteArg(&local_e88,(string *)local_48);
  strings::internal::SubstituteArg::SubstituteArg(&local_eb8);
  strings::internal::SubstituteArg::SubstituteArg(&local_ee8);
  strings::internal::SubstituteArg::SubstituteArg(&local_f18);
  strings::internal::SubstituteArg::SubstituteArg(&local_f48);
  strings::internal::SubstituteArg::SubstituteArg(&local_f78);
  strings::internal::SubstituteArg::SubstituteArg(&local_fa8);
  strings::internal::SubstituteArg::SubstituteArg(&local_fd8);
  strings::internal::SubstituteArg::SubstituteArg(&local_1008);
  strings::internal::SubstituteArg::SubstituteArg(&local_1038);
  strings::SubstituteAndAppend
            (contents,"$0}\n",&local_e88,&local_eb8,&local_ee8,&local_f18,&local_f48,&local_f78,
             &local_fa8,&local_fd8,&local_1008,&local_1038);
  anon_unknown_1::SourceLocationCommentPrinter::AddPostComment
            ((SourceLocationCommentPrinter *)local_f8,contents);
  anon_unknown_1::SourceLocationCommentPrinter::~SourceLocationCommentPrinter
            ((SourceLocationCommentPrinter *)local_f8);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void EnumDescriptor::DebugString(
    int depth, std::string* contents,
    const DebugStringOptions& debug_string_options) const {
  std::string prefix(depth * 2, ' ');
  ++depth;

  SourceLocationCommentPrinter comment_printer(this, prefix,
                                               debug_string_options);
  comment_printer.AddPreComment(contents);

  strings::SubstituteAndAppend(contents, "$0enum $1 {\n", prefix, name());

  FormatLineOptions(depth, options(), file()->pool(), contents);

  for (int i = 0; i < value_count(); i++) {
    value(i)->DebugString(depth, contents, debug_string_options);
  }

  if (reserved_range_count() > 0) {
    strings::SubstituteAndAppend(contents, "$0  reserved ", prefix);
    for (int i = 0; i < reserved_range_count(); i++) {
      const EnumDescriptor::ReservedRange* range = reserved_range(i);
      if (range->end == range->start) {
        strings::SubstituteAndAppend(contents, "$0, ", range->start);
      } else if (range->end == INT_MAX) {
        strings::SubstituteAndAppend(contents, "$0 to max, ", range->start);
      } else {
        strings::SubstituteAndAppend(contents, "$0 to $1, ", range->start,
                                  range->end);
      }
    }
    contents->replace(contents->size() - 2, 2, ";\n");
  }

  if (reserved_name_count() > 0) {
    strings::SubstituteAndAppend(contents, "$0  reserved ", prefix);
    for (int i = 0; i < reserved_name_count(); i++) {
      strings::SubstituteAndAppend(contents, "\"$0\", ",
                                CEscape(reserved_name(i)));
    }
    contents->replace(contents->size() - 2, 2, ";\n");
  }

  strings::SubstituteAndAppend(contents, "$0}\n", prefix);

  comment_printer.AddPostComment(contents);
}